

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O0

void __thiscall
net_tests::anon_unknown_17::V2TransportTester::SendV1Version
          (V2TransportTester *this,MessageStartChars *magic)

{
  uchar *__first;
  char *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long in_FS_OFFSET;
  DataStream ser;
  CMessageHeader hdr;
  DataStream *in_stack_ffffffffffffff28;
  CMessageHeader *in_stack_ffffffffffffff30;
  DataStream *in_stack_ffffffffffffff38;
  DataStream *this_00;
  undefined8 in_stack_ffffffffffffff48;
  RandomMixin<FastRandomContext> *in_stack_ffffffffffffff50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__last;
  MessageStartChars *in_stack_ffffffffffffff70;
  const_iterator in_stack_ffffffffffffff88;
  DataStream local_48;
  CMessageHeader local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  RandomMixin<FastRandomContext>::randrange<int>
            (in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  CMessageHeader::CMessageHeader
            (&local_20,in_stack_ffffffffffffff70,in_RSI,(uint)((ulong)in_RDI >> 0x20));
  local_48.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.m_read_pos = 0;
  local_48.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  DataStream::DataStream(in_stack_ffffffffffffff28);
  DataStream::operator<<(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  __last = in_RDI + 0x5d;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff30);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_ffffffffffffff38,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_ffffffffffffff30);
  DataStream::data(in_stack_ffffffffffffff38);
  __first = UCharCast((byte *)in_stack_ffffffffffffff28);
  this_00 = &local_48;
  DataStream::data(this_00);
  DataStream::size(this_00);
  UCharCast((byte *)in_stack_ffffffffffffff28);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
            (in_RDI,in_stack_ffffffffffffff88,__first,(uchar *)__last);
  DataStream::~DataStream(in_stack_ffffffffffffff28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SendV1Version(const MessageStartChars& magic)
    {
        CMessageHeader hdr(magic, "version", 126 + m_rng.randrange(11));
        DataStream ser{};
        ser << hdr;
        m_to_send.insert(m_to_send.end(), UCharCast(ser.data()), UCharCast(ser.data() + ser.size()));
    }